

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

void * __thiscall google::protobuf::internal::ExtensionSet::Extension::PrefetchPtr(Extension *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  void *pvVar7;
  char *extraout_RDX;
  uint uVar8;
  undefined1 *puVar9;
  LongSooRep *this_00;
  ulong *puVar10;
  CheckOpMessageBuilder aCStack_1d8 [112];
  ios_base aiStack_168 [264];
  char acStack_40 [8];
  code *pcStack_38;
  undefined1 auStack_28 [8];
  undefined8 uStack_20;
  
  bVar2 = (byte)(this->type - 9) < 4 | this->is_repeated;
  bVar1 = this->field_0xa;
  if (bVar2 == (bVar1 & 1)) {
    if ((bVar1 & 1) != 0) {
      this = (Extension *)(this->field_0).int64_t_value;
    }
    return this;
  }
  this_00 = (LongSooRep *)(ulong)bVar1;
  uVar8 = (uint)bVar2;
  uStack_20 = 0x144939;
  PrefetchPtr();
  uVar3 = 2;
  if (uVar8 == 0) {
    uVar3 = this_00->capacity;
  }
  if (0 < (int)uVar3) {
    if ((char)uVar8 != '\0') {
      return &this_00->size;
    }
    pcVar4 = LongSooRep::elements(this_00);
    return pcVar4;
  }
  puVar9 = auStack_28;
  puVar10 = (ulong *)(ulong)uVar3;
  pcStack_38 = LongSooRep::elements;
  RepeatedField<int>::elements();
  if ((void *)(*puVar10 & 0xfffffffffffffff8) != (void *)0x0) {
    return (void *)(*puVar10 & 0xfffffffffffffff8);
  }
  pcVar4 = acStack_40;
  LongSooRep::elements();
  absl::lts_20240722::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
            (aCStack_1d8,extraout_RDX);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)&absl::lts_20240722::log_internal::kCharNull;
  }
  sVar5 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aCStack_1d8,pcVar4,sVar5);
  poVar6 = (ostream *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::ForVar2();
  absl::lts_20240722::log_internal::MakeCheckOpValueString(poVar6,puVar9);
  pvVar7 = (void *)absl::lts_20240722::log_internal::CheckOpMessageBuilder::NewString_abi_cxx11_();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aCStack_1d8);
  std::ios_base::~ios_base(aiStack_168);
  return pvVar7;
}

Assistant:

const void* PrefetchPtr() const {
      ABSL_DCHECK_EQ(is_pointer, is_repeated || FieldTypeIsPointer(type));
      // We don't want to prefetch invalid/null pointers so if there isn't a
      // pointer to prefetch, then return `this`.
      return is_pointer ? absl::bit_cast<const void*>(ptr) : this;
    }